

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreSkipTables.h
# Opt level: O0

void __thiscall
axl::sl::BoyerMooreGoodSkipTableBase<wchar_t>::BoyerMooreGoodSkipTableBase
          (BoyerMooreGoodSkipTableBase<wchar_t> *this)

{
  BoyerMooreSkipTableRoot::BoyerMooreSkipTableRoot((BoyerMooreSkipTableRoot *)0x13e66e);
  return;
}

Assistant:

bool
	build(
		const C* pattern,
		size_t patternLength
	) {
		bool result = m_table.setCount(patternLength);
		if (!result)
			return false;

		sl::Array<size_t>::Rwi rwi = m_table;
		intptr_t lastPrefixPos = patternLength - 1;
		for (intptr_t i = patternLength - 1; i >= 0; i--) {
			if (isPrefix(pattern, patternLength, i + 1))
				lastPrefixPos = i + 1;

			rwi[i] = lastPrefixPos + patternLength - 1 - i;
		}

		for (intptr_t i = 0; i < patternLength - 1; i++) {
			size_t suffixLength = calcSuffixLength(pattern, patternLength, i);
			if (pattern[i - suffixLength] != pattern[patternLength - 1 - suffixLength])
				rwi[patternLength - 1 - suffixLength] = patternLength - 1 - i + suffixLength;
		}

		return true;
	}